

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase916::run(TestCase916 *this)

{
  WaitScope *waitScope;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  Client pipeline;
  Client client;
  Client cap;
  PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client> paf;
  Client resolved;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults> echo;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  echoRequest;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call5;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call4;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call3;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call2;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> earlyCall;
  Runnable local_4c0 [2];
  NullableValue<kj::Exception> exception;
  Maybe<capnp::MessageSize> local_350;
  Maybe<capnp::MessageSize> local_338;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_320 [3];
  Own<capnp::ResponseHook> local_2f0;
  Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  local_2e0 [3];
  Own<capnp::ResponseHook> local_2b0;
  TestContext context;
  NullableValue<kj::Exception> local_188;
  
  TestContext::TestContext(&context);
  TestContext::connect((TestContext *)&exception,(int)&context,(sockaddr *)0x5,in_ECX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            (&client,(Client *)&exception);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&exception);
  kj::newPromiseAndFulfiller<capnproto_test::capnp::test::TestCallOrder::Client>();
  capnproto_test::capnp::test::TestCallOrder::Client::
  Client<capnproto_test::capnp::test::TestCallOrder::Client,void>(&cap,&paf.promise);
  local_338.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&exception,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),
             &local_338);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&earlyCall,(int)&exception,__buf,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)((long)&exception.field_1 + 0x20))
  ;
  local_350.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest(&echoRequest,&client,&local_350);
  capnproto_test::capnp::test::TestMoreStuff::EchoParams::Builder::setCap
            (&echoRequest.super_Builder,&cap);
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
          *)&echo,(int)&echoRequest,__buf_00,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Pipeline::getCap
            (&pipeline,&echo.super_Pipeline);
  getCallSequence(&call0,&pipeline,0);
  getCallSequence(&call1,&pipeline,1);
  waitScope = &context.waitScope;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_2e0,&earlyCall);
  kj::Own<capnp::ResponseHook>::dispose(&local_2b0);
  getCallSequence(&call2,&pipeline,2);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *)
             &exception,&echo);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Reader::getCap
            (&resolved,(Reader *)&exception);
  kj::Own<capnp::ResponseHook>::dispose
            ((Own<capnp::ResponseHook> *)&exception.field_1.value.description);
  getCallSequence(&call3,&pipeline,3);
  getCallSequence(&call4,&pipeline,4);
  getCallSequence(&call5,&pipeline,5);
  local_4c0[0]._vptr_Runnable = (_func_int **)&PTR_run_0065d3c8;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_188,local_4c0);
  kj::_::NullableValue<kj::Exception>::NullableValue(&exception,&local_188);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_188);
  if (exception.isSet == true) {
    (*(paf.fulfiller.ptr)->_vptr_PromiseFulfiller[1])(paf.fulfiller.ptr,&exception.field_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&exception);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call0.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call1.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call2.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call3.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call4.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&call5.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,waitScope);
  getCallSequence((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                   *)&exception,(Client *)(&client.field_0x0 + *(long *)(client._0_8_ + -0x20)),1);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait(local_320,&exception);
  kj::Own<capnp::ResponseHook>::dispose(&local_2f0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &exception);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call5);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call4);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call3);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&resolved.field_0x8);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call2);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call1);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&call0);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&pipeline.field_0x8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::EchoResults>::~RemotePromise(&echo);
  kj::Own<capnp::RequestHook>::dispose(&echoRequest.hook);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&earlyCall);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  kj::PromiseFulfillerPair<capnproto_test::capnp::test::TestCallOrder::Client>::
  ~PromiseFulfillerPair(&paf);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  TestContext::~TestContext(&context);
  return;
}

Assistant:

TEST(Rpc, EmbargoError) {
  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto paf = kj::newPromiseAndFulfiller<test::TestCallOrder::Client>();

  auto cap = test::TestCallOrder::Client(kj::mv(paf.promise));

  auto earlyCall = client.getCallSequenceRequest().send();

  auto echoRequest = client.echoRequest();
  echoRequest.setCap(cap);
  auto echo = echoRequest.send();

  auto pipeline = echo.getCap();

  auto call0 = getCallSequence(pipeline, 0);
  auto call1 = getCallSequence(pipeline, 1);

  earlyCall.wait(context.waitScope);

  auto call2 = getCallSequence(pipeline, 2);

  auto resolved = echo.wait(context.waitScope).getCap();

  auto call3 = getCallSequence(pipeline, 3);
  auto call4 = getCallSequence(pipeline, 4);
  auto call5 = getCallSequence(pipeline, 5);

  paf.fulfiller->rejectIfThrows([]() { KJ_FAIL_ASSERT("foo") { break; } });

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);
  expectPromiseThrows(kj::mv(call2), context.waitScope);
  expectPromiseThrows(kj::mv(call3), context.waitScope);
  expectPromiseThrows(kj::mv(call4), context.waitScope);
  expectPromiseThrows(kj::mv(call5), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 1).wait(context.waitScope);
}